

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_block.h
# Opt level: O2

bool __thiscall
spvtools::opt::BasicBlock::WhileEachInst
          (BasicBlock *this,function<bool_(spvtools::opt::Instruction_*)> *f,
          bool run_on_debug_line_insts)

{
  bool bVar1;
  bool bVar2;
  Instruction *pIVar3;
  Instruction *pIVar4;
  
  pIVar3 = (this->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  if ((pIVar3 == (Instruction *)0x0) ||
     (bVar1 = Instruction::WhileEachInst(pIVar3,f,run_on_debug_line_insts), bVar1)) {
    pIVar3 = (this->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
             super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
    bVar1 = true;
    if ((pIVar3 != (Instruction *)0x0) &&
       ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
      pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::front
                         (&(this->insts_).super_IntrusiveList<spvtools::opt::Instruction>);
      do {
        bVar1 = pIVar3 == (Instruction *)0x0;
        if (bVar1) {
          return bVar1;
        }
        pIVar4 = (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
        if ((pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
          pIVar4 = (Instruction *)0x0;
        }
        bVar2 = Instruction::WhileEachInst(pIVar3,f,run_on_debug_line_insts);
        pIVar3 = pIVar4;
      } while (bVar2);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool BasicBlock::WhileEachInst(
    const std::function<bool(Instruction*)>& f, bool run_on_debug_line_insts) {
  if (label_) {
    if (!label_->WhileEachInst(f, run_on_debug_line_insts)) return false;
  }
  if (insts_.empty()) {
    return true;
  }

  Instruction* inst = &insts_.front();
  while (inst != nullptr) {
    Instruction* next_instruction = inst->NextNode();
    if (!inst->WhileEachInst(f, run_on_debug_line_insts)) return false;
    inst = next_instruction;
  }
  return true;
}